

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenGetter_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type *type)

{
  int iVar1;
  char *pcVar2;
  string *getter;
  char *pcVar3;
  allocator<char> local_71;
  undefined1 local_70 [32];
  string local_50;
  
  switch(type->base_type) {
  case BASE_TYPE_STRING:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "__p.__string";
    pcVar2 = "";
    break;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_ARRAY:
    local_70._0_4_ = type->element;
    local_70._24_2_ = type->fixed_length;
    local_70._4_4_ = BASE_TYPE_NONE;
    local_70._8_8_ = type->struct_def;
    local_70._16_8_ = type->enum_def;
    GenGetter_abi_cxx11_(__return_storage_ptr__,this,(Type *)local_70);
    return __return_storage_ptr__;
  case BASE_TYPE_STRUCT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "__p.__struct";
    pcVar2 = "";
    break;
  case BASE_TYPE_UNION:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "__p.__union";
    pcVar2 = "";
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"__p.bb.Get","");
    if ((ulong)type->base_type == 2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "0!=",__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_70);
      local_50._M_dataplus._M_p = (pointer)CONCAT44(local_70._4_4_,local_70._0_4_);
      local_50.field_2._M_allocated_capacity = local_70._16_8_;
      if (local_50._M_dataplus._M_p == local_70 + 0x10) {
        return __return_storage_ptr__;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_70,GenTypeBasic::csharp_typename[type->base_type],
                 (allocator<char> *)&local_50);
      iVar1 = std::__cxx11::string::compare(local_70);
      if ((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_) != local_70 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_),
                        (ulong)(local_70._16_8_ + 1));
      }
      if (iVar1 == 0) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,GenTypeBasic::csharp_typename[type->base_type],&local_71);
      ConvertCase((string *)local_70,&local_50,kUpperCamel,kSnake);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,CONCAT44(local_70._4_4_,local_70._0_4_));
      if ((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_) != local_70 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_),
                        (ulong)(local_70._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return __return_storage_ptr__;
      }
    }
    operator_delete(local_50._M_dataplus._M_p,
                    (ulong)((long)&(((EnumDef *)local_50.field_2._M_allocated_capacity)->
                                   super_Definition).name._M_dataplus._M_p + 1));
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string GenGetter(const Type &type) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "__p.__string";
      case BASE_TYPE_STRUCT: return "__p.__struct";
      case BASE_TYPE_UNION: return "__p.__union";
      case BASE_TYPE_VECTOR: return GenGetter(type.VectorType());
      case BASE_TYPE_ARRAY: return GenGetter(type.VectorType());
      default: {
        std::string getter = "__p.bb.Get";
        if (type.base_type == BASE_TYPE_BOOL) {
          getter = "0!=" + getter;
        } else if (GenTypeBasic(type, false) != "byte") {
          getter += ConvertCase(GenTypeBasic(type, false), Case::kUpperCamel);
        }
        return getter;
      }
    }
  }